

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

uint32 __thiscall Clasp::Solver::estimateBCP(Solver *this,Literal *p,int rd)

{
  Assignment *out;
  uint uVar1;
  uint uVar2;
  size_type sVar3;
  Literal p_00;
  pointer puVar4;
  SharedContext *pSVar5;
  bool bVar6;
  size_type sVar7;
  size_type sVar8;
  size_type sVar9;
  
  uVar1 = p->rep_;
  puVar4 = (this->assign_).assign_.ebo_.buf;
  uVar2 = *(uint *)((long)puVar4 + (ulong)(uVar1 & 0xfffffffc));
  if ((uVar2 & 3) != 0) {
    return 0;
  }
  out = &this->assign_;
  sVar3 = (this->assign_).trail.ebo_.size;
  puVar4[uVar1 >> 2] = (uVar2 - ((uVar1 & 2) == 0)) + 2;
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back(&out->trail,p);
  pSVar5 = this->shared_;
  uVar1 = (pSVar5->btig_).graph_.ebo_.size;
  sVar7 = sVar3;
  do {
    p_00.rep_ = (out->trail).ebo_.buf[sVar7].rep_;
    if (p_00.rep_ >> 1 < uVar1) {
      bVar6 = ShortImplicationsGraph::propagateBin(&pSVar5->btig_,out,p_00,0);
      sVar8 = (this->assign_).trail.ebo_.size;
      sVar9 = sVar8;
      if (!bVar6) {
LAB_00163ca8:
        while (sVar8 != sVar3) {
          Assignment::undoLast(out);
          sVar8 = (this->assign_).trail.ebo_.size;
        }
        return sVar9 - sVar3;
      }
    }
    else {
      sVar8 = (this->assign_).trail.ebo_.size;
    }
    sVar7 = sVar7 + 1;
    bVar6 = rd == 0;
    rd = rd + -1;
    sVar9 = sVar8;
    if ((sVar8 <= sVar7) || (bVar6)) goto LAB_00163ca8;
  } while( true );
}

Assistant:

uint32 Solver::estimateBCP(const Literal& p, int rd) const {
	if (value(p.var()) != value_free) return 0;
	LitVec::size_type first = assign_.assigned();
	LitVec::size_type i     = first;
	Solver& self            = const_cast<Solver&>(*this);
	self.assign_.setValue(p.var(), trueValue(p));
	self.assign_.trail.push_back(p);
	const ShortImplicationsGraph& btig = shared_->shortImplications();
	const uint32 maxIdx = btig.size();
	do {
		Literal x = assign_.trail[i++];
		if (x.id() < maxIdx && !btig.propagateBin(self.assign_, x, 0)) {
			break;
		}
	} while (i < assign_.assigned() && rd-- != 0);
	i = assign_.assigned()-first;
	while (self.assign_.assigned() != first) {
		self.assign_.undoLast();
	}
	return (uint32)i;
}